

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dynamic_message_unittest.cc
# Opt level: O2

void __thiscall
google::protobuf::(anonymous_namespace)::DynamicMessageTest_Arena_Test::
~DynamicMessageTest_Arena_Test(DynamicMessageTest_Arena_Test *this)

{
  protobuf::anon_unknown_0::DynamicMessageTest_Arena_Test::~DynamicMessageTest_Arena_Test
            ((DynamicMessageTest_Arena_Test *)(this + -0x10));
  return;
}

Assistant:

TEST_P(DynamicMessageTest, Arena) {
  Arena arena;
  Message* message = prototype_->New(&arena);
  Message* extension_message = extensions_prototype_->New(&arena);
  Message* packed_message = packed_prototype_->New(&arena);
  Message* oneof_message = oneof_prototype_->New(&arena);

  // avoid unused-variable error.
  (void)message;
  (void)extension_message;
  (void)packed_message;
  (void)oneof_message;
  // Return without freeing: should not leak.
}